

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O0

void tb_phys_invalidate_mips
               (TCGContext_conflict3 *tcg_ctx,TranslationBlock_conflict *tb,tb_page_addr_t page_addr
               )

{
  tb_page_addr_t page_addr_local;
  TranslationBlock_conflict *tb_local;
  TCGContext_conflict3 *tcg_ctx_local;
  
  if ((page_addr == 0xffffffffffffffff) && (tb->page_addr[0] != 0xffffffffffffffff)) {
    page_lock_tb(tcg_ctx->uc,tb);
    do_tb_phys_invalidate(tcg_ctx,tb,true);
    page_unlock_tb(tcg_ctx->uc,tb);
  }
  else {
    do_tb_phys_invalidate(tcg_ctx,tb,false);
  }
  return;
}

Assistant:

void tb_phys_invalidate(TCGContext *tcg_ctx, TranslationBlock *tb, tb_page_addr_t page_addr)
{
    if (page_addr == -1 && tb->page_addr[0] != -1) {
        page_lock_tb(tcg_ctx->uc, tb);
        do_tb_phys_invalidate(tcg_ctx, tb, true);
        page_unlock_tb(tcg_ctx->uc, tb);
    } else {
        do_tb_phys_invalidate(tcg_ctx, tb, false);
    }
}